

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O1

int inform_bin_step(double *series,size_t n,double step,int *binned,inform_error *err)

{
  double dVar1;
  inform_error iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (series != (double *)0x0) {
    if (n == 0) {
      iVar2 = INFORM_ESHORTSERIES;
      goto LAB_00108e4f;
    }
    if (step <= 2.220446049250313e-15) {
      iVar2 = INFORM_EBIN;
      goto LAB_00108e4f;
    }
    if (binned != (int *)0x0) {
      dVar8 = *series;
      dVar9 = dVar8;
      if (n != 1) {
        sVar4 = 1;
        do {
          dVar7 = series[sVar4];
          dVar1 = dVar7;
          if (dVar9 <= dVar7) {
            dVar1 = dVar9;
          }
          dVar9 = dVar1;
          if (dVar7 <= dVar8) {
            dVar7 = dVar8;
          }
          dVar8 = dVar7;
          sVar4 = sVar4 + 1;
        } while (n != sVar4);
      }
      dVar7 = ceil((dVar8 - dVar9) / step);
      dVar8 = fmod(dVar8 - dVar9,step);
      iVar5 = (int)dVar7 + (uint)(dVar8 == 0.0);
      lVar6 = 0;
      while( true ) {
        dVar8 = floor((series[lVar6] - dVar9) / step);
        iVar3 = (int)dVar8;
        binned[lVar6] = iVar3;
        if ((iVar3 < 0) || (iVar5 <= iVar3)) break;
        lVar6 = lVar6 + 1;
        if (n + (n == 0) == lVar6) {
          return iVar5;
        }
      }
      __assert_fail("0 <= binned[i] && binned[i] < b",
                    "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                    ,0x51,
                    "int inform_bin_step(const double *, size_t, double, int *, inform_error *)");
    }
  }
  iVar2 = INFORM_ETIMESERIES;
LAB_00108e4f:
  if (err != (inform_error *)0x0) {
    *err = iVar2;
  }
  return 0;
}

Assistant:

int inform_bin_step(double const *series, size_t n, double step, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (step <= 10.*DBL_EPSILON)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    int b = (int) ceil(range / step);

    if (fmod(range,step) == 0.0) ++b;

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return b;
}